

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf_test.cc
# Opt level: O3

void __thiscall PBKDFTest_EmptyPassword_Test::TestBody(PBKDFTest_EmptyPassword_Test *this)

{
  int iVar1;
  EVP_MD *pEVar2;
  char *pcVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer *__ptr;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  Bytes local_90;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint8_t kKey [20];
  uint8_t key [20];
  
  kKey[0] = 0xa3;
  kKey[1] = '=';
  kKey[2] = 0xdd;
  kKey[3] = 0xc3;
  kKey[4] = '\x04';
  kKey[5] = 'x';
  kKey[6] = '\x18';
  kKey[7] = 'U';
  kKey[8] = '\x15';
  kKey[9] = '1';
  kKey[10] = '\x1f';
  kKey[0xb] = 0x87;
  kKey[0xc] = 'R';
  kKey[0xd] = 0x89;
  kKey[0xe] = ']';
  kKey[0xf] = '6';
  kKey[0x10] = 0xea;
  kKey[0x11] = 'C';
  kKey[0x12] = 'c';
  kKey[0x13] = 0xa2;
  pEVar2 = EVP_sha1();
  iVar1 = PKCS5_PBKDF2_HMAC((char *)0x0,0,"salt",4,1,pEVar2,0x14,key);
  local_a0[0] = iVar1 != 0;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_a0,
               (AssertionResult *)
               "PKCS5_PBKDF2_HMAC(__null, 0, (const uint8_t *)\"salt\", 4, 1, EVP_sha1(), sizeof(kKey), key)"
               ,"false","true",(char *)pEVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
               ,0x21,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    local_70 = local_98;
    if ((long *)local_90.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.span_.data_ + 8))();
      local_70 = local_98;
    }
  }
  else {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
    local_90.span_.size_ = 0x14;
    local_a0 = (undefined1  [8])kKey;
    local_90.span_.data_ = key;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_78,"Bytes(kKey)","Bytes(key)",(Bytes *)local_a0,&local_90);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x22,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    pEVar2 = EVP_sha1();
    pcVar3 = "";
    iVar1 = PKCS5_PBKDF2_HMAC("",0,"salt",4,1,pEVar2,0x14,key);
    local_a0[0] = iVar1 != 0;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
      local_90.span_.size_ = 0x14;
      local_a0 = (undefined1  [8])kKey;
      local_90.span_.data_ = key;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_78,"Bytes(kKey)","Bytes(key)",(Bytes *)local_a0,&local_90);
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a0);
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_70->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                   ,0x26,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_a0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a0 + 8))();
        }
      }
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_70;
      goto LAB_0028cc6a;
    }
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_a0,
               (AssertionResult *)
               "PKCS5_PBKDF2_HMAC(\"\", 0, (const uint8_t *)\"salt\", 4, 1, EVP_sha1(), sizeof(kKey), key)"
               ,"false","true",(char *)pEVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
               ,0x25,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    local_70 = local_98;
    if ((long *)local_90.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.span_.data_ + 8))();
      local_70 = local_98;
    }
  }
  if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_98;
  local_98 = local_70;
LAB_0028cc6a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_70);
  return;
}

Assistant:

TEST(PBKDFTest, EmptyPassword) {
  const uint8_t kKey[] = {0xa3, 0x3d, 0xdd, 0xc3, 0x04, 0x78, 0x18,
                          0x55, 0x15, 0x31, 0x1f, 0x87, 0x52, 0x89,
                          0x5d, 0x36, 0xea, 0x43, 0x63, 0xa2};
  uint8_t key[sizeof(kKey)];

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC(NULL, 0, (const uint8_t *)"salt", 4, 1,
                                EVP_sha1(), sizeof(kKey), key));
  EXPECT_EQ(Bytes(kKey), Bytes(key));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("", 0, (const uint8_t *)"salt", 4, 1,
                                EVP_sha1(), sizeof(kKey), key));
  EXPECT_EQ(Bytes(kKey), Bytes(key));
}